

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O0

void __thiscall
Threadpool<Workerthread>::enqueue<void(&)(position&,limits&,bool),position&,limits&,bool&>
          (Threadpool<Workerthread> *this,_func_void_position_ptr_limits_ptr_bool *f,position *args,
          limits *args_1,bool *args_2)

{
  reference_wrapper<bool> local_78;
  reference_wrapper<limits> local_70;
  reference_wrapper<position> local_68;
  type local_60;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock;
  bool *args_local_2;
  limits *args_local_1;
  position *args_local;
  _func_void_position_ptr_limits_ptr_bool *f_local;
  Threadpool<Workerthread> *this_local;
  
  lock._8_8_ = args_2;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_40,&this->m);
  local_68 = std::ref<position>(args);
  local_70 = std::ref<limits>(args_1);
  local_78 = std::ref<bool>((bool *)lock._8_8_);
  std::
  bind<void(&)(position&,limits&,bool),std::reference_wrapper<position>,std::reference_wrapper<limits>,std::reference_wrapper<bool>>
            (&local_60,f,&local_68,&local_70,&local_78);
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::_Bind<void(*(std::reference_wrapper<position>,std::reference_wrapper<limits>,std::reference_wrapper<bool>))(position&,limits&,bool)>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)&this->tasks,
             &local_60);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  return;
}

Assistant:

void enqueue(TT&& f, Args&&... args) {
		std::unique_lock<std::mutex> lock(m);
		// args to bind are copied or moved (not passed by reference) .. unless wrapped in std::ref()
		tasks.emplace_back(std::bind(std::forward<TT>(f), std::ref(std::forward<Args>(args))...));
		cv_task.notify_one();
	}